

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token)

{
  Location pCVar1;
  ushort uVar2;
  ValueHolder *pVVar3;
  ValueHolder VVar4;
  Value *pVVar5;
  Location pCVar6;
  ValueHolder VVar7;
  ValueHolder VVar8;
  bool bVar9;
  _Elt_pointer ppVVar10;
  undefined1 auVar11 [16];
  string decoded;
  string local_68;
  ValueHolder local_48;
  ushort local_40;
  ValueHolder local_30;
  ValueHolder VStack_28;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  bVar9 = decodeString(this,token,&local_68);
  if (bVar9) {
    Value::Value((Value *)&local_48,&local_68);
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar3 = &ppVVar10[-1]->value_;
    uVar2 = *(ushort *)(pVVar3 + 1);
    VVar4 = *pVVar3;
    *pVVar3 = local_48;
    *(ushort *)(pVVar3 + 1) = local_40 & 0x1ff | uVar2 & 0xfe00;
    local_40 = uVar2 & 0x1ff | local_40 & 0xfe00;
    VVar7 = pVVar3[3];
    VVar8 = pVVar3[4];
    pVVar3[3] = local_30;
    pVVar3[4] = VStack_28;
    local_48 = VVar4;
    local_30 = VVar7;
    VStack_28 = VVar8;
    Value::~Value((Value *)&local_48);
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar10 = ppVVar10 + -1;
    }
    pVVar5 = *ppVVar10;
    pCVar6 = token->end_;
    pCVar1 = this->begin_;
    auVar11._8_4_ = (int)pCVar1;
    auVar11._0_8_ = pCVar1;
    auVar11._12_4_ = (int)((ulong)pCVar1 >> 0x20);
    pVVar5->start_ = (long)token->start_ - (long)pCVar1;
    pVVar5->limit_ = (long)pCVar6 - auVar11._8_8_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return bVar9;
}

Assistant:

bool Reader::decodeString(Token& token) {
  std::string decoded;
  if (!decodeString(token, decoded))
    return false;
  currentValue() = decoded;
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}